

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,ArgSlot arg,RegSlot reg)

{
  bool bVar1;
  uchar local_23;
  unsigned_short uStack_22;
  uint local_20;
  ArgSlot AStack_1c;
  OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  RegSlot reg_local;
  ArgSlot arg_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_20 = reg;
  AStack_1c = arg;
  layout.Reg = op;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_char,unsigned_short>(&local_23,arg);
  if ((bVar1) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                        (&uStack_22,local_20), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,layout.Reg,&local_23,3,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteArg(OpCode op, ArgSlot arg, RegSlot reg)
    {
        OpLayoutT_Arg<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Arg, arg) && SizePolicy::Assign(layout.Reg, reg))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }